

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall duckdb_re2::Regexp::ParseState::ParsePerlFlags(ParseState *this,StringPiece *s)

{
  const_pointer pcVar1;
  RegexpStatus *pRVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  ParseFlags PVar7;
  bool bVar8;
  char *pcVar9;
  int iVar10;
  StringPiece t;
  Rune c;
  StringPiece local_1c8;
  undefined1 local_1b0 [8];
  size_type local_1a8;
  ios_base local_138 [264];
  
  local_1c8.data_ = s->data_;
  local_1c8.size_ = s->size_;
  PVar7 = this->flags_;
  if (((((PVar7 >> 9 & 1) == 0) || (local_1c8.size_ < 2)) || (*local_1c8.data_ != '(')) ||
     (local_1c8.data_[1] != '?')) {
    this->status_->code_ = kRegexpInternalError;
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Bad call to ParseState::ParsePerlFlags",0x26);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    pcVar9 = local_1c8.data_ + 2;
    local_1c8.size_ = local_1c8.size_ - 2;
    if (((local_1c8.size_ < 3) || (*pcVar9 != 'P')) || (local_1c8.data_[3] != '<')) {
      bVar8 = false;
      bVar3 = false;
      bVar4 = false;
      iVar10 = 4;
      local_1c8.data_ = pcVar9;
      do {
        if (local_1c8.size_ == 0) goto LAB_0186991e;
        iVar5 = StringPieceToRune((Rune *)local_1b0,&local_1c8,this->status_);
        if (iVar5 < 0) {
          iVar10 = 1;
          goto LAB_0186991e;
        }
        if ((int)local_1b0._0_4_ < 0x55) {
          if (local_1b0._0_4_ != 0x29) {
            if (local_1b0._0_4_ == 0x2d) {
              if (!bVar4) {
                bVar4 = true;
                bVar3 = false;
                goto LAB_01869906;
              }
              goto LAB_0186991e;
            }
            if (local_1b0._0_4_ != 0x3a) goto LAB_0186991e;
            DoLeftParenNoCapture(this);
          }
          bVar8 = true;
        }
        else {
          if ((int)local_1b0._0_4_ < 0x6d) {
            if (local_1b0._0_4_ == 0x55) {
              if (bVar4) {
                PVar7 = PVar7 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|
                                 PerlClasses|Latin1|OneLine|MatchNL|Literal|FoldCase);
              }
              else {
                PVar7 = PVar7 | NonGreedy;
              }
            }
            else {
              if (local_1b0._0_4_ != 0x69) goto LAB_0186991e;
              if (bVar4) {
                PVar7 = PVar7 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|
                                 PerlClasses|NonGreedy|Latin1|OneLine|MatchNL|Literal);
              }
              else {
                PVar7 = PVar7 | FoldCase;
              }
            }
          }
          else if (local_1b0._0_4_ == 0x6d) {
            if (bVar4) {
              PVar7 = PVar7 | OneLine;
            }
            else {
              PVar7 = PVar7 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               NonGreedy|Latin1|MatchNL|Literal|FoldCase);
            }
          }
          else {
            if (local_1b0._0_4_ != 0x73) goto LAB_0186991e;
            if (bVar4) {
              PVar7 = PVar7 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               NonGreedy|Latin1|OneLine|ClassNL|Literal|FoldCase);
            }
            else {
              PVar7 = PVar7 | DotNL;
            }
          }
          bVar3 = true;
        }
LAB_01869906:
      } while (!bVar8);
      iVar10 = 2;
LAB_0186991e:
      if (iVar10 != 4) {
        if (iVar10 != 2) {
          return false;
        }
        if ((!bVar4) || (bVar3)) {
          this->flags_ = PVar7;
          s->data_ = local_1c8.data_;
          s->size_ = local_1c8.size_;
          return true;
        }
      }
      pRVar2 = this->status_;
      pRVar2->code_ = kRegexpBadPerlOp;
      pcVar1 = s->data_;
      (pRVar2->error_arg_).data_ = pcVar1;
      (pRVar2->error_arg_).size_ = (long)local_1c8.data_ - (long)pcVar1;
    }
    else {
      local_1c8.data_ = pcVar9;
      sVar6 = StringPiece::find(&local_1c8,'>',2);
      pcVar1 = local_1c8.data_;
      if (sVar6 == 0xffffffffffffffff) {
        bVar4 = IsValidUTF8(s,this->status_);
        if (bVar4) {
          pRVar2 = this->status_;
          pRVar2->code_ = kRegexpBadNamedCapture;
          sVar6 = s->size_;
          (pRVar2->error_arg_).data_ = s->data_;
          (pRVar2->error_arg_).size_ = sVar6;
        }
      }
      else {
        local_1b0 = (undefined1  [8])(local_1c8.data_ + 2);
        local_1a8 = sVar6 - 2;
        bVar4 = IsValidUTF8((StringPiece *)local_1b0,this->status_);
        if (bVar4) {
          pcVar9 = pcVar1 + -2;
          bVar4 = IsValidCaptureName((StringPiece *)local_1b0);
          if (bVar4) {
            DoLeftParen(this,(StringPiece *)local_1b0);
            pcVar1 = s->data_;
            s->data_ = pcVar9 + sVar6 + 3;
            s->size_ = (size_type)(pcVar1 + (s->size_ - (long)(pcVar9 + sVar6 + 3)));
            return true;
          }
          pRVar2 = this->status_;
          pRVar2->code_ = kRegexpBadNamedCapture;
          (pRVar2->error_arg_).data_ = pcVar9;
          (pRVar2->error_arg_).size_ = sVar6 + 3;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParsePerlFlags(StringPiece* s) {
  StringPiece t = *s;

  // Caller is supposed to check this.
  if (!(flags_ & PerlX) || t.size() < 2 || t[0] != '(' || t[1] != '?') {
    status_->set_code(kRegexpInternalError);
    LOG(DFATAL) << "Bad call to ParseState::ParsePerlFlags";
    return false;
  }

  t.remove_prefix(2);  // "(?"

  // Check for named captures, first introduced in Python's regexp library.
  // As usual, there are three slightly different syntaxes:
  //
  //   (?P<name>expr)   the original, introduced by Python
  //   (?<name>expr)    the .NET alteration, adopted by Perl 5.10
  //   (?'name'expr)    another .NET alteration, adopted by Perl 5.10
  //
  // Perl 5.10 gave in and implemented the Python version too,
  // but they claim that the last two are the preferred forms.
  // PCRE and languages based on it (specifically, PHP and Ruby)
  // support all three as well.  EcmaScript 4 uses only the Python form.
  //
  // In both the open source world (via Code Search) and the
  // Google source tree, (?P<expr>name) is the dominant form,
  // so that's the one we implement.  One is enough.
  if (t.size() > 2 && t[0] == 'P' && t[1] == '<') {
    // Pull out name.
    size_t end = t.find('>', 2);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(*s, status_))
        return false;
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(*s);
      return false;
    }

    // t is "P<name>...", t[end] == '>'
    StringPiece capture(t.data()-2, end+3);  // "(?P<name>"
    StringPiece name(t.data()+2, end-2);     // "name"
    if (!IsValidUTF8(name, status_))
      return false;
    if (!IsValidCaptureName(name)) {
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(capture);
      return false;
    }

    if (!DoLeftParen(name)) {
      // DoLeftParen's failure set status_.
      return false;
    }

    s->remove_prefix(
        static_cast<size_t>(capture.data() + capture.size() - s->data()));
    return true;
  }

  bool negated = false;
  bool sawflags = false;
  int nflags = flags_;
  Rune c;
  for (bool done = false; !done; ) {
    if (t.empty())
      goto BadPerlOp;
    if (StringPieceToRune(&c, &t, status_) < 0)
      return false;
    switch (c) {
      default:
        goto BadPerlOp;

      // Parse flags.
      case 'i':
        sawflags = true;
        if (negated)
          nflags &= ~FoldCase;
        else
          nflags |= FoldCase;
        break;

      case 'm':  // opposite of our OneLine
        sawflags = true;
        if (negated)
          nflags |= OneLine;
        else
          nflags &= ~OneLine;
        break;

      case 's':
        sawflags = true;
        if (negated)
          nflags &= ~DotNL;
        else
          nflags |= DotNL;
        break;

      case 'U':
        sawflags = true;
        if (negated)
          nflags &= ~NonGreedy;
        else
          nflags |= NonGreedy;
        break;

      // Negation
      case '-':
        if (negated)
          goto BadPerlOp;
        negated = true;
        sawflags = false;
        break;

      // Open new group.
      case ':':
        if (!DoLeftParenNoCapture()) {
          // DoLeftParenNoCapture's failure set status_.
          return false;
        }
        done = true;
        break;

      // Finish flags.
      case ')':
        done = true;
        break;
    }
  }

  if (negated && !sawflags)
    goto BadPerlOp;

  flags_ = static_cast<Regexp::ParseFlags>(nflags);
  *s = t;
  return true;

BadPerlOp:
  status_->set_code(kRegexpBadPerlOp);
  status_->set_error_arg(
      StringPiece(s->data(), static_cast<size_t>(t.data() - s->data())));
  return false;
}